

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core.hpp
# Opt level: O2

bool __thiscall iutest::UnitTest::Failed(UnitTest *this)

{
  bool bVar1;
  
  bVar1 = Passed(this);
  return !bVar1;
}

Assistant:

bool            Failed()            const { return !Passed(); }